

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
blockify(cashew::Ref_(void *this,Ref ast)

{
  bool bVar1;
  Ref *this_00;
  Value *this_01;
  Ref r;
  ExpressionProcessor *this_local;
  Ref ast_local;
  Ref ret;
  
  bVar1 = isBlock(cashew::Ref_(this,ast);
  ast_local.inst = ast.inst;
  if (!bVar1) {
    ast_local = cashew::ValueBuilder::makeBlock();
    this_00 = cashew::Ref::operator[](&ast_local,1);
    this_01 = cashew::Ref::operator->(this_00);
    r = cashew::ValueBuilder::makeStatement(ast);
    cashew::Value::push_back(this_01,r);
  }
  return (Ref)ast_local.inst;
}

Assistant:

Ref blockify(Ref ast) {
      if (isBlock(ast)) {
        return ast;
      }
      Ref ret = ValueBuilder::makeBlock();
      ret[1]->push_back(ValueBuilder::makeStatement(ast));
      return ret;
    }